

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ManTransformRefs(Gia_Man_t *p,int *pnObjs,int *pnFanios)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Vec_Int_t *vSuper_00;
  Vec_Int_t *vVisit_00;
  bool bVar4;
  int local_4c;
  int local_48;
  int Counter;
  int k;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVisit;
  Vec_Int_t *vSuper;
  int *pnFanios_local;
  int *pnObjs_local;
  Gia_Man_t *p_local;
  
  if (p->pRefs == (int *)0x0) {
    __assert_fail("p->pRefs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                  ,0x16c,"void Frc_ManTransformRefs(Gia_Man_t *, int *, int *)");
  }
  Gia_ManCleanMark0(p);
  pGVar2 = Gia_ManConst0(p);
  *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
  Counter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar4 = false;
    if (Counter < iVar1) {
      pFanin = Gia_ManCi(p,Counter);
      bVar4 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xffffffffbfffffff | 0x40000000;
    Counter = Counter + 1;
  }
  Counter = 0;
  while( true ) {
    bVar4 = false;
    if (Counter < p->nObjs) {
      pFanin = Gia_ManObj(p,Counter);
      bVar4 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(pFanin);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjRefNum(p,pFanin);
      *(ulong *)pFanin = *(ulong *)pFanin & 0xffffffffbfffffff | (ulong)(1 < iVar1) << 0x1e;
    }
    Counter = Counter + 1;
  }
  Counter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar4 = false;
    if (Counter < iVar1) {
      pGVar2 = Gia_ManCo(p,Counter);
      pFanin = Gia_ObjFanin0(pGVar2);
      bVar4 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xffffffffbfffffff | 0x40000000;
    Counter = Counter + 1;
  }
  local_4c = 0;
  Counter = 0;
  while( true ) {
    bVar4 = false;
    if (Counter < p->nObjs) {
      pFanin = Gia_ManObj(p,Counter);
      bVar4 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    local_4c = ((uint)(*(ulong *)pFanin >> 0x1e) & 1) + local_4c;
    Counter = Counter + 1;
  }
  iVar1 = Gia_ManCoNum(p);
  *pnObjs = local_4c + iVar1;
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  iVar1 = Gia_ManObjNum(p);
  piVar3 = (int *)calloc((long)iVar1,4);
  p->pRefs = piVar3;
  local_4c = 0;
  vSuper_00 = Vec_IntAlloc(100);
  vVisit_00 = Vec_IntAlloc(100);
  Gia_ManCleanMark1(p);
  Counter = 0;
  while( true ) {
    bVar4 = false;
    if (Counter < p->nObjs) {
      pFanin = Gia_ManObj(p,Counter);
      bVar4 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(pFanin);
    if ((iVar1 != 0) && ((*(ulong *)pFanin >> 0x1e & 1) != 0)) {
      Frc_ManCollectSuper(p,pFanin,vSuper_00,vVisit_00);
      local_48 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(vSuper_00);
        bVar4 = false;
        if (local_48 < iVar1) {
          iVar1 = Vec_IntEntry(vSuper_00,local_48);
          _k = Gia_ManObj(p,iVar1);
          bVar4 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar4) break;
        if ((*(ulong *)_k >> 0x1e & 1) == 0) {
          __assert_fail("pFanin->fMark0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                        ,400,"void Frc_ManTransformRefs(Gia_Man_t *, int *, int *)");
        }
        Gia_ObjRefInc(p,_k);
        local_48 = local_48 + 1;
      }
      iVar1 = Vec_IntSize(vSuper_00);
      local_4c = iVar1 + local_4c;
    }
    Counter = Counter + 1;
  }
  Gia_ManCheckMark1(p);
  Vec_IntFree(vSuper_00);
  Vec_IntFree(vVisit_00);
  Counter = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar4 = false;
    if (Counter < iVar1) {
      pGVar2 = Gia_ManCo(p,Counter);
      pFanin = Gia_ObjFanin0(pGVar2);
      bVar4 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    if ((*(ulong *)pFanin >> 0x1e & 1) == 0) {
      __assert_fail("pObj->fMark0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                    ,0x19b,"void Frc_ManTransformRefs(Gia_Man_t *, int *, int *)");
    }
    Gia_ObjRefInc(p,pFanin);
    Counter = Counter + 1;
  }
  iVar1 = Gia_ManCoNum(p);
  *pnFanios = local_4c + iVar1;
  return;
}

Assistant:

void Frc_ManTransformRefs( Gia_Man_t * p, int * pnObjs, int * pnFanios )  
{
    Vec_Int_t * vSuper, * vVisit;
    Gia_Obj_t * pObj, * pFanin;
    int i, k, Counter;
    assert( p->pRefs != NULL );

    // mark nodes to be used in the logic network
    Gia_ManCleanMark0( p );
    Gia_ManConst0(p)->fMark0 = 1;
    // mark the inputs
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 1;
    // mark those nodes that have ref count more than 1
    Gia_ManForEachAnd( p, pObj, i )
        pObj->fMark0 = (Gia_ObjRefNum(p, pObj) > 1);
    // mark the output drivers
    Gia_ManForEachCoDriver( p, pObj, i )
        pObj->fMark0 = 1;

    // count the number of nodes
    Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
        Counter += pObj->fMark0;
    *pnObjs = Counter + Gia_ManCoNum(p);

    // reset the references
    ABC_FREE( p->pRefs );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    // reference from internal nodes
    Counter = 0;
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManCleanMark1( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
            continue;
        Frc_ManCollectSuper( p, pObj, vSuper, vVisit );
        Gia_ManForEachObjVec( vSuper, p, pFanin, k )
        {
            assert( pFanin->fMark0 );
            Gia_ObjRefInc( p, pFanin );
        }
        Counter += Vec_IntSize( vSuper );
    }
    Gia_ManCheckMark1( p );
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // reference from outputs
    Gia_ManForEachCoDriver( p, pObj, i )
    {
        assert( pObj->fMark0 );
        Gia_ObjRefInc( p, pObj );
    }
    *pnFanios = Counter + Gia_ManCoNum(p);
}